

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenaViolation.c
# Opt level: O3

Vec_Ptr_t * collectCSSignalsWithDSC(Abc_Ntk_t *pNtk,Aig_Man_t *pAig)

{
  size_t __size;
  void *pvVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  char *pcVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  void *local_40;
  
  pVVar2 = (Vec_Ptr_t *)malloc(0x10);
  pVVar2->nCap = 8;
  pVVar2->nSize = 0;
  ppvVar3 = (void **)malloc(0x40);
  pVVar2->pArray = ppvVar3;
  if (0 < pAig->nTruePos) {
    iVar6 = 0;
    uVar9 = 8;
    lVar7 = 0;
    local_40 = (void *)0x0;
    do {
      if ((pAig->vCos->nSize <= lVar7) || (pNtk->vPos->nSize <= lVar7)) {
LAB_00637e0b:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar1 = pAig->vCos->pArray[lVar7];
      pcVar4 = Abc_ObjName((Abc_Obj_t *)pNtk->vPos->pArray[lVar7]);
      pcVar4 = strstr(pcVar4,"csLiveConst_");
      if (pcVar4 == (char *)0x0) {
        if (pNtk->vPos->nSize <= lVar7) goto LAB_00637e0b;
        pcVar4 = Abc_ObjName((Abc_Obj_t *)pNtk->vPos->pArray[lVar7]);
        pcVar4 = strstr(pcVar4,"csLiveTarget_");
        if (pcVar4 != (char *)0x0) {
          local_40 = *(void **)((long)pvVar1 + 8);
        }
      }
      else {
        pvVar1 = *(void **)((long)pvVar1 + 8);
        iVar8 = (int)uVar9;
        if (iVar6 == iVar8) {
          if (iVar8 < 0x10) {
            if (pVVar2->pArray == (void **)0x0) {
              ppvVar3 = (void **)malloc(0x80);
            }
            else {
              ppvVar3 = (void **)realloc(pVVar2->pArray,0x80);
            }
            pVVar2->pArray = ppvVar3;
            pVVar2->nCap = 0x10;
            uVar9 = 0x10;
          }
          else {
            uVar9 = (ulong)(uint)(iVar8 * 2);
            if (pVVar2->pArray == (void **)0x0) {
              ppvVar3 = (void **)malloc(uVar9 * 8);
            }
            else {
              ppvVar3 = (void **)realloc(pVVar2->pArray,uVar9 * 8);
            }
            pVVar2->pArray = ppvVar3;
            pVVar2->nCap = iVar8 * 2;
          }
        }
        else {
          ppvVar3 = pVVar2->pArray;
        }
        lVar5 = (long)iVar6;
        iVar6 = iVar6 + 1;
        pVVar2->nSize = iVar6;
        ppvVar3[lVar5] = pvVar1;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < pAig->nTruePos);
    if (local_40 != (void *)0x0) {
      iVar8 = (int)uVar9;
      if (iVar6 == iVar8) {
        if (iVar8 < 0x10) {
          if (pVVar2->pArray == (void **)0x0) {
            ppvVar3 = (void **)malloc(0x80);
          }
          else {
            ppvVar3 = (void **)realloc(pVVar2->pArray,0x80);
          }
          pVVar2->pArray = ppvVar3;
          pVVar2->nCap = 0x10;
        }
        else {
          __size = (ulong)(uint)(iVar8 * 2) * 8;
          if (pVVar2->pArray == (void **)0x0) {
            ppvVar3 = (void **)malloc(__size);
          }
          else {
            ppvVar3 = (void **)realloc(pVVar2->pArray,__size);
          }
          pVVar2->pArray = ppvVar3;
          pVVar2->nCap = iVar8 * 2;
        }
      }
      else {
        ppvVar3 = pVVar2->pArray;
      }
      pVVar2->nSize = iVar6 + 1;
      ppvVar3[iVar6] = local_40;
      return pVVar2;
    }
  }
  __assert_fail("pConsequent",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/arenaViolation.c"
                ,0xfa,"Vec_Ptr_t *collectCSSignalsWithDSC(Abc_Ntk_t *, Aig_Man_t *)");
}

Assistant:

Vec_Ptr_t *collectCSSignalsWithDSC( Abc_Ntk_t *pNtk, Aig_Man_t *pAig )
{
    int i;
    Aig_Obj_t *pObj, *pConsequent = NULL;
    Vec_Ptr_t *vNodeArray;

    vNodeArray = Vec_PtrAlloc(1);

    Saig_ManForEachPo( pAig, pObj, i )
    {
        if( strstr( Abc_ObjName(Abc_NtkPo( pNtk, i )), "csLiveConst_" ) != NULL )
            Vec_PtrPush( vNodeArray, Aig_NotCond((Aig_Obj_t *)Aig_ObjFanin0(pObj), Aig_ObjFaninC0(pObj)) );    
        else if( strstr( Abc_ObjName(Abc_NtkPo( pNtk, i )), "csLiveTarget_" ) != NULL )
            pConsequent = Aig_NotCond((Aig_Obj_t *)Aig_ObjFanin0(pObj), Aig_ObjFaninC0(pObj));
    }
    assert( pConsequent );
    Vec_PtrPush( vNodeArray, pConsequent );    
    return vNodeArray;
}